

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29931::TestFailingTestHasFailures::RunImpl(TestFailingTestHasFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  int local_6c;
  ScopedCurrentTest scopedResults;
  Test local_58;
  TestResults results;
  
  UnitTest::TestResults::TestResults(&results,(TestReporter *)0x0);
  ScopedCurrentTest::ScopedCurrentTest(&scopedResults,&results,(TestDetails *)0x0);
  UnitTest::Test::Test(&local_58,"failing","DefaultSuite","",0);
  local_58._vptr_Test = (_func_int **)&PTR__Test_001514d0;
  UnitTest::Test::Run(&local_58);
  UnitTest::Test::~Test(&local_58);
  ScopedCurrentTest::~ScopedCurrentTest(&scopedResults);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  scopedResults.m_oldTestResults._0_4_ = 1;
  local_6c = UnitTest::TestResults::GetFailureCount(&results);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_58,*ppTVar2,0x32);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&scopedResults,&local_6c,(TestDetails *)&local_58)
  ;
  return;
}

Assistant:

TEST(FailingTestHasFailures)
{
    class FailingTest : public Test
    {
    public:
        FailingTest() : Test("failing") {}
        virtual void RunImpl() const
        {
            CHECK(false);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		FailingTest().Run();
	}

    CHECK_EQUAL(1, results.GetFailureCount());
}